

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SerialNumberMap::GarbageCollectHelper(ON_SerialNumberMap *this)

{
  SN_ELEMENT *__dest;
  undefined8 *puVar1;
  ON__UINT64 *pOVar2;
  undefined8 *puVar3;
  ON_SerialNumberMapPrivate *pOVar4;
  ON_SN_BLOCK *pOVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ON__UINT64 OVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ON_SerialNumberMap *this_00;
  ON_SN_BLOCK **ppOVar14;
  ON_SN_BLOCK *pOVar15;
  ON_SerialNumberMap *pOVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  size_t sVar21;
  SN_ELEMENT *pSVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ON__UINT64 OVar27;
  bool bVar28;
  
  if (this->m_bHashTableIsValid != '\0') {
    this->m_bHashTableIsValid = '\0';
  }
  pOVar15 = this->m_sn_block0;
  uVar20 = pOVar15->m_purged;
  if (uVar20 == 0) {
    if (pOVar15->m_sorted == 0) {
      ON_SN_BLOCK::SortBlockHelper(pOVar15);
      OVar27 = this->m_snblk_list_count;
      pOVar15 = this->m_sn_block0;
      if (OVar27 == 0) {
        pOVar4 = this->m_private;
        uVar13 = pOVar15->m_sn1;
        pOVar4->m_maxsn = uVar13;
        if (uVar13 < 0xffffffff) {
          pOVar4->m_lower_maxsn = uVar13;
        }
        OVar27 = 0;
      }
    }
    else {
      OVar27 = this->m_snblk_list_count;
    }
  }
  else {
    this->m_sn_count = this->m_sn_count - (ulong)uVar20;
    this->m_sn_purged = this->m_sn_purged - (ulong)uVar20;
    ON_SN_BLOCK::CullBlockHelper(pOVar15);
    pOVar15 = this->m_sn_block0;
    if (pOVar15->m_sorted == 0) {
      ON_SN_BLOCK::SortBlockHelper(pOVar15);
      pOVar15 = this->m_sn_block0;
    }
    OVar27 = this->m_snblk_list_count;
    if (OVar27 == 0) {
      pOVar4 = this->m_private;
      uVar13 = pOVar15->m_sn1;
      pOVar4->m_maxsn = uVar13;
      if (uVar13 < 0xffffffff) {
        pOVar4->m_lower_maxsn = uVar13;
      }
    }
    if (pOVar15->m_count < 0x1c00) {
      return;
    }
  }
  this->m_sn_purged = 0;
  uVar13 = (ulong)pOVar15->m_count;
  while( true ) {
    this->m_sn_count = uVar13;
    bVar28 = OVar27 == 0;
    OVar27 = OVar27 - 1;
    if (bVar28) break;
    pOVar15 = this->m_snblk_list[OVar27];
    if (pOVar15->m_purged != 0) {
      ON_SN_BLOCK::CullBlockHelper(pOVar15);
      uVar13 = this->m_sn_count;
      pOVar15 = this->m_snblk_list[OVar27];
    }
    uVar13 = uVar13 + pOVar15->m_count;
  }
  uVar13 = this->m_snblk_list_count;
  pOVar16 = (ON_SerialNumberMap *)this->m_snblk_list;
  this_00 = pOVar16;
  for (uVar19 = 0; sVar21 = uVar13 - uVar19, sVar21 != 0; uVar19 = uVar19 + 1) {
    if (((ON_SN_BLOCK *)this_00->m_private)->m_count == 0) goto LAB_004eae67;
    this_00 = (ON_SerialNumberMap *)&this_00->m_sn_count;
  }
  if (uVar13 == 0) {
LAB_004eaea8:
    uVar13 = 0;
  }
  else {
LAB_004eaeb2:
    if (this->m_sn_block0->m_sn0 <
        *(ulong *)(*(long *)((pOVar16->m_inactive_id).Data4 + uVar13 * 8 + -0x70) + 0x18)) {
      this_00 = (ON_SerialNumberMap *)onmalloc(0xe0000);
      uVar13 = 0;
      while ((uVar13 < this->m_snblk_list_count &&
             (pOVar15 = this->m_sn_block0, pOVar15->m_count != 0))) {
        pOVar5 = this->m_snblk_list[uVar13];
        if (pOVar15->m_sn0 <= pOVar5->m_sn1) {
          if (uVar13 < this->m_snblk_list_count - 1) {
            uVar19 = this->m_snblk_list[uVar13 + 1]->m_sn0;
          }
          else {
            uVar19 = pOVar15->m_sn1 + 1;
          }
          __dest = pOVar5->m_sn;
          uVar20 = 0;
          uVar25 = 0;
          uVar23 = 0;
LAB_004eaf3a:
          uVar26 = pOVar5->m_count;
          if ((uVar26 <= uVar20) || (pOVar15 = this->m_sn_block0, pOVar15->m_count <= (uint)uVar25))
          goto LAB_004eb005;
          uVar6 = pOVar15->m_sn[uVar25].m_sn;
          if (pOVar5->m_sn[uVar20].m_sn < uVar6) {
            pSVar22 = __dest + uVar20;
            uVar20 = uVar20 + 1;
LAB_004eaf89:
            lVar17 = uVar23 * 0x38;
            *(anon_union_8_5_72d3814f_for_m_u *)((long)&this_00->m_inactive_id + lVar17 + -0x30) =
                 (pSVar22->m_value).m_u;
            uVar7 = *(undefined8 *)&pSVar22->m_id;
            uVar8 = *(undefined8 *)(pSVar22->m_id).Data4;
            OVar27 = pSVar22->m_sn;
            OVar9 = *(ON__UINT64 *)&pSVar22->m_sn_active;
            uVar10 = *(undefined8 *)&pSVar22->m_value;
            puVar1 = (undefined8 *)((long)&this_00->m_inactive_id + lVar17 + -0x40);
            *puVar1 = pSVar22->m_next;
            puVar1[1] = uVar10;
            pOVar2 = (ON__UINT64 *)((long)&this_00->m_inactive_id + lVar17 + -0x50);
            *pOVar2 = OVar27;
            pOVar2[1] = OVar9;
            puVar1 = (undefined8 *)((long)&this_00->m_inactive_id + lVar17 + -0x60);
            *puVar1 = uVar7;
            puVar1[1] = uVar8;
            uVar23 = (ulong)((int)uVar23 + 1);
            goto LAB_004eaf3a;
          }
          if (uVar6 < uVar19) {
            pSVar22 = pOVar15->m_sn + uVar25;
            uVar25 = (ulong)((uint)uVar25 + 1);
            goto LAB_004eaf89;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_lookup.cpp"
                     ,0x61b,"","Bogus information - should never get here");
          uVar26 = pOVar5->m_count;
LAB_004eb005:
          uVar26 = uVar26 - uVar20;
          if (uVar26 == 0) {
            lVar17 = uVar25 * 0x38 + 0x30;
            while( true ) {
              pOVar15 = this->m_sn_block0;
              uVar20 = pOVar15->m_count;
              if ((uVar20 <= uVar25) ||
                 (uVar19 <= *(ulong *)((long)(&pOVar15->m_sn[0].m_id + -2) + lVar17))) break;
              puVar1 = (undefined8 *)((long)(&pOVar15->m_sn[0].m_id + -2) + lVar17);
              uVar25 = uVar25 + 1;
              lVar18 = uVar23 * 0x38;
              *(undefined8 *)((long)&this_00->m_inactive_id + lVar18 + -0x30) = puVar1[4];
              uVar7 = puVar1[-2];
              uVar8 = puVar1[-1];
              uVar10 = *puVar1;
              uVar11 = puVar1[1];
              uVar12 = puVar1[3];
              puVar3 = (undefined8 *)((long)&this_00->m_inactive_id + lVar18 + -0x40);
              *puVar3 = puVar1[2];
              puVar3[1] = uVar12;
              puVar1 = (undefined8 *)((long)&this_00->m_inactive_id + lVar18 + -0x50);
              *puVar1 = uVar10;
              puVar1[1] = uVar11;
              puVar1 = (undefined8 *)((long)&this_00->m_inactive_id + lVar18 + -0x60);
              *puVar1 = uVar7;
              puVar1[1] = uVar8;
              lVar17 = lVar17 + 0x38;
              uVar23 = (ulong)((int)uVar23 + 1);
            }
          }
          else {
            memcpy((void *)((long)&this_00->m_inactive_id + uVar23 * 0x38 + -0x60),__dest + uVar20,
                   (ulong)uVar26 * 0x38);
            uVar23 = (ulong)((int)uVar23 + uVar26);
            pOVar15 = this->m_sn_block0;
            uVar20 = pOVar15->m_count;
          }
          uVar26 = (uint)uVar23;
          uVar19 = 0x2000;
          if (uVar26 < 0x2000) {
            uVar19 = uVar23;
          }
          uVar24 = (uint)uVar25;
          if (uVar24 <= uVar20 && uVar20 - uVar24 != 0) {
            memcpy((void *)((long)&this_00->m_inactive_id + uVar23 * 0x38 + -0x60),
                   pOVar15->m_sn + (uVar25 & 0xffffffff),(ulong)(uVar20 - uVar24) * 0x38);
            uVar26 = (uVar26 - uVar24) + this->m_sn_block0->m_count;
          }
          uVar24 = (uint)uVar19;
          pOVar5->m_count = uVar24;
          memcpy(__dest,this_00,uVar19 * 0x38);
          pOVar5->m_sn0 = pOVar5->m_sn[0].m_sn;
          pOVar5->m_sn1 = pOVar5->m_sn[uVar24 - 1].m_sn;
          uVar20 = uVar26 - uVar24;
          if (uVar26 < uVar24 || uVar20 == 0) {
            pOVar15 = this->m_sn_block0;
            pOVar15->m_count = 0;
            pOVar15->m_purged = 0;
            pOVar15->m_sorted = 1;
            pOVar15->m_sn0 = 0;
            pOVar15->m_sn1 = 0;
          }
          else {
            pOVar15 = this->m_sn_block0;
            pOVar15->m_count = uVar20;
            memcpy(pOVar15->m_sn,(void *)((long)&this_00->m_inactive_id + (uVar19 * 0x38 - 0x60)),
                   (ulong)uVar20 * 0x38);
            pOVar15 = this->m_sn_block0;
            pOVar15->m_sn0 = pOVar15->m_sn[0].m_sn;
            pOVar15->m_sn1 = pOVar15->m_sn[pOVar15->m_count - 1].m_sn;
          }
        }
        uVar13 = uVar13 + 1;
      }
      onfree(this_00);
      uVar13 = this->m_snblk_list_count;
    }
  }
  uVar19 = 0;
LAB_004eb1b7:
  uVar23 = uVar19;
  if (uVar23 < uVar13) {
    uVar19 = uVar23 + 1;
    for (uVar25 = uVar19; uVar25 < uVar13; uVar25 = uVar25 + 1) {
      pOVar15 = this->m_snblk_list[uVar23];
      if (0x1fff < pOVar15->m_count) break;
      GarbageCollectMoveHelper(this_00,pOVar15,this->m_snblk_list[uVar25]);
      uVar13 = this->m_snblk_list_count;
    }
    goto LAB_004eb1b7;
  }
  do {
    uVar13 = uVar13 - 1;
    if (uVar13 == 0xffffffffffffffff) {
      uVar20 = this->m_sn_block0->m_count;
      if (0x800 < uVar20) {
LAB_004eb238:
        if (0x1000 < uVar20) {
          OVar27 = this->m_snblk_list_count;
          ppOVar14 = this->m_snblk_list;
          if (OVar27 == this->m_snblk_list_capacity) {
            this->m_snblk_list_capacity = OVar27 + 0x20;
            sVar21 = OVar27 * 8 + 0x100;
            if (ppOVar14 == (ON_SN_BLOCK **)0x0) {
              ppOVar14 = (ON_SN_BLOCK **)onmalloc(sVar21);
            }
            else {
              ppOVar14 = (ON_SN_BLOCK **)onrealloc(ppOVar14,sVar21);
            }
            this->m_snblk_list = ppOVar14;
            uVar13 = this->m_snblk_list_capacity;
            for (; ppOVar14 = this->m_snblk_list, OVar27 < uVar13; OVar27 = OVar27 + 1) {
              ppOVar14[OVar27] = (ON_SN_BLOCK *)0x0;
            }
            OVar27 = this->m_snblk_list_count;
          }
          pOVar15 = ppOVar14[OVar27];
          if (pOVar15 == (ON_SN_BLOCK *)0x0) {
            pOVar15 = (ON_SN_BLOCK *)onmalloc(0x70020);
            OVar27 = this->m_snblk_list_count;
            this->m_snblk_list[OVar27] = pOVar15;
            pOVar15 = this->m_snblk_list[OVar27];
          }
          this->m_snblk_list_count = OVar27 + 1;
          memcpy(pOVar15,this->m_sn_block0,0x70020);
          pOVar15 = this->m_sn_block0;
          pOVar15->m_count = 0;
          pOVar15->m_purged = 0;
          pOVar15->m_sorted = 1;
          pOVar15->m_sn0 = 0;
          pOVar15->m_sn1 = 0;
        }
      }
      return;
    }
    if (this->m_snblk_list[uVar13]->m_count != 0) {
      if (this->m_sn_block0->m_count < 0x801) {
        return;
      }
      GarbageCollectMoveHelper(this_00,this->m_snblk_list[uVar13],this->m_sn_block0);
      uVar20 = this->m_sn_block0->m_count;
      goto LAB_004eb238;
    }
    this->m_snblk_list_count = uVar13;
  } while( true );
  while (lVar17 = uVar19 * 8, uVar19 = uVar19 + 1,
        **(int **)((pOVar16->m_inactive_id).Data4 + lVar17 + -0x60) == 0) {
LAB_004eae67:
    if (uVar13 <= uVar19 + 1) goto LAB_004eae9f;
  }
  ON_qsort(this_00,sVar21,8,ON_SN_BLOCK::CompareMaxSN);
  pOVar16 = (ON_SerialNumberMap *)this->m_snblk_list;
  uVar13 = this->m_snblk_list_count;
LAB_004eae9f:
  do {
    uVar19 = uVar13 - 1;
    if (uVar19 == 0xffffffffffffffff) goto LAB_004eaea8;
    if (**(int **)((pOVar16->m_inactive_id).Data4 + uVar13 * 8 + -0x70) != 0) goto LAB_004eaeb2;
    this->m_snblk_list_count = uVar19;
    uVar13 = uVar19;
  } while( true );
}

Assistant:

void ON_SerialNumberMap::GarbageCollectHelper()
{
  ON__UINT64 i,m;
  ON__UINT32 j,k,n;

  // This is a helper function.  The caller
  // should check that ON_SN_BLOCK::SN_BLOCK_CAPACITY == m_sn_block0.m_count
  // before calling it.

  // memory location for specific elements will be changed.
  // This will make the hash table invalid.
  Internal_HashTableInvalidate();

  if ( m_sn_block0.m_purged > 0 )
  {
    m_sn_count -= m_sn_block0.m_purged;
    m_sn_purged -= m_sn_block0.m_purged;
    m_sn_block0.CullBlockHelper();
    if ( !m_sn_block0.m_sorted )
      m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
    if ( m_sn_block0.m_count < 7*(ON_SN_BLOCK::SN_BLOCK_CAPACITY/8) )
      return;
  }
  else if ( !m_sn_block0.m_sorted )
  {
    m_sn_block0.SortBlockHelper();
    if ( 0 == m_snblk_list_count )
      m_private->SetMaxSn(m_sn_block0.m_sn1);
  }

  // Remove all purged serial numbers from every block
  // and make sure every block is sorted.
  m_sn_purged = 0;
  m_sn_count = m_sn_block0.m_count;
  i = m_snblk_list_count;
  while (i--)
  {
    if ( m_snblk_list[i]->m_purged > 0 )
    {
      // The next call may empty m_snblk_list[i].
      m_snblk_list[i]->CullBlockHelper();
    }
    m_sn_count += m_snblk_list[i]->m_count;
  }

  // Put empty blocks at the end of the list
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      // m_snblk_list[i] is empty ...
      for(m = i+1; m < m_snblk_list_count; m++ )
      {
        if ( m_snblk_list[m]->m_count > 0 )
        {
          // ... and m_snblk_list[m] is not empty
          ON_qsort(m_snblk_list+i,(size_t)(m_snblk_list_count-i),sizeof(*m_snblk_list),ON_SN_BLOCK::CompareMaxSN);
          break;
        }
      }
      while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
        m_snblk_list_count--;
      break;
    }
  }

  if (    m_snblk_list_count > 0 
       && m_snblk_list[m_snblk_list_count-1]->m_sn1 > m_sn_block0.m_sn0 
     )
  {
    // Merge the serial number lists so the blocks in m_sn_list[]
    // have the lowest serial numbers and m_sn_block0.m_sn[] contains
    // the largest.
    ON__UINT32 snarray_count = 0;
    struct SN_ELEMENT* snarray = (struct SN_ELEMENT*)onmalloc(2*ON_SN_BLOCK::SN_BLOCK_CAPACITY*sizeof(snarray[0]));
    for ( i = 0; i < m_snblk_list_count && m_sn_block0.m_count > 0; i++ )
    {
      if ( m_snblk_list[i]->m_sn1 < m_sn_block0.m_sn0 )
        continue;

      // Move some entries in m_sn_block0.m_sn[] 
      // to m_snblk_list[i]->m_sn[].
      ON_SN_BLOCK* blk = m_snblk_list[i];
      const ON__UINT64 sn1 = (i < m_snblk_list_count-1) 
                             ? m_snblk_list[i+1]->m_sn0 
                             : (m_sn_block0.m_sn1+1);
      snarray_count = j = k = 0;
      while(j < blk->m_count && k < m_sn_block0.m_count )
      {
        if ( blk->m_sn[j].m_sn < m_sn_block0.m_sn[k].m_sn )
        {
          snarray[snarray_count++] = blk->m_sn[j++];
        }
        else if ( m_sn_block0.m_sn[k].m_sn < sn1 )
        {
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
        }
        else
        {
          // If m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn is the largest
          // value, then we should get j == blk->m_count exit.
          // If blk->m_sn[blk->m_count-1].m_sn is the largest value,
          // then we should get k == m_sn_block0.m_count and exit.
          ON_ERROR("Bogus information - should never get here");
          break;
        }
      }
      n = blk->m_count-j;
      if ( n > 0 )
      {
        memcpy(&snarray[snarray_count],&blk->m_sn[j],(size_t)(n*sizeof(snarray[0])));
        snarray_count += n;
      }
      else
      {
        while ( k < m_sn_block0.m_count && m_sn_block0.m_sn[k].m_sn < sn1 )
          snarray[snarray_count++] = m_sn_block0.m_sn[k++];
      }
      n = (snarray_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY) 
        ? ON_SN_BLOCK::SN_BLOCK_CAPACITY 
        : snarray_count;
      if ( k < m_sn_block0.m_count )
      {
        memcpy(&snarray[snarray_count],
               &m_sn_block0.m_sn[k],
               (size_t)((m_sn_block0.m_count-k)*sizeof(snarray[0]))
               );
        snarray_count += (m_sn_block0.m_count-k);
      }
      blk->m_count = n;
      memcpy(&blk->m_sn[0],snarray,(size_t)(blk->m_count*sizeof(blk->m_sn[0])));
      blk->m_sn0 = blk->m_sn[0].m_sn;
      blk->m_sn1 = blk->m_sn[blk->m_count-1].m_sn;
      if ( snarray_count > n )
      {
        // put the end of snarray[] (the largest serial numbers)
        // in m_sn_block0.m_sn[].
        m_sn_block0.m_count = (snarray_count-n);
        memcpy(&m_sn_block0.m_sn[0],
               &snarray[n],
               (size_t)(m_sn_block0.m_count*sizeof(m_sn_block0.m_sn[0]))
               );
        m_sn_block0.m_sn0 = m_sn_block0.m_sn[0].m_sn;
        m_sn_block0.m_sn1 = m_sn_block0.m_sn[m_sn_block0.m_count-1].m_sn;
      }
      else
      {
        m_sn_block0.EmptyBlock();
      }
    }
    onfree(snarray);
    snarray = 0;
  }

  // Compact the blocks in m_sn_list[]
  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    for ( m = i+1; m < m_snblk_list_count; m++ )
    {
      if ( m_snblk_list[i]->m_count >= ON_SN_BLOCK::SN_BLOCK_CAPACITY )
        break;
      GarbageCollectMoveHelper(m_snblk_list[i],m_snblk_list[m]);
    }
  }
  while ( m_snblk_list_count > 0 && 0 == m_snblk_list[m_snblk_list_count-1]->m_count )
  {
    m_snblk_list_count--;
  }

  // Make sure m_sn_block0.m_an[] is has plenty of room
  if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/4 )
  {
    if ( m_snblk_list_count > 0 )
    {
      GarbageCollectMoveHelper(m_snblk_list[m_snblk_list_count-1],&m_sn_block0);
    }
    if ( m_sn_block0.m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY/2 )
    {
      // Need to add a new block to m_snblk_list[]
      if ( m_snblk_list_count == m_snblk_list_capacity )
      {
        // Add room to store more pointers to blocks in the m_sn_list[]
        i = m_snblk_list_capacity;
        m_snblk_list_capacity += 32;
        m = m_snblk_list_capacity*sizeof(m_snblk_list[0]);
        m_snblk_list = (ON_SN_BLOCK**)((0 == m_snblk_list)
                     ? onmalloc((size_t)m)
                     : onrealloc(m_snblk_list,(size_t)m));
        while ( i < m_snblk_list_capacity )
          m_snblk_list[i++] = 0;
      }
      if ( 0 == m_snblk_list[m_snblk_list_count] )
      {
        // add room to store at more serial numbers
        m_snblk_list[m_snblk_list_count] = (ON_SN_BLOCK*)onmalloc(sizeof(*(m_snblk_list[m_snblk_list_count])));
      }
      *m_snblk_list[m_snblk_list_count++] = m_sn_block0;
      m_sn_block0.EmptyBlock();
    }
  }
}